

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FeatureTypes.pb.cc
# Opt level: O0

void __thiscall CoreML::Specification::ImageFeatureType::Clear(ImageFeatureType *this)

{
  ImageFeatureType *this_local;
  
  memset(&this->width_,0,0x14);
  clear_SizeFlexibility(this);
  return;
}

Assistant:

void ImageFeatureType::Clear() {
// @@protoc_insertion_point(message_clear_start:CoreML.Specification.ImageFeatureType)
  ::memset(&width_, 0, reinterpret_cast<char*>(&colorspace_) -
    reinterpret_cast<char*>(&width_) + sizeof(colorspace_));
  clear_SizeFlexibility();
}